

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O1

void __thiscall
imrt::Station::revert
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  mapped_type *pmVar1;
  _List_node_base *p_Var2;
  pair<int,_double> let;
  _List_node_base *local_38;
  _List_node_base *p_Stack_30;
  
  p_Var2 = (diff->super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)diff) {
    do {
      local_38 = p_Var2[1]._M_next;
      p_Stack_30 = p_Var2[1]._M_prev;
      pmVar1 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[](&this->beam2pos,(key_type_conflict *)&local_38);
      change_intensity(this,pmVar1->first,pmVar1->second,
                       (this->I).p[pmVar1->first][pmVar1->second] - (double)p_Stack_30,
                       (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x0
                      );
      p_Var2 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)diff);
  }
  return;
}

Assistant:

void revert(list< pair< int, double > >& diff){
    for(auto let:diff){
      pair <int,int> a = beam2pos[let.first];
      change_intensity(a.first, a.second, I(a.first, a.second) - let.second);
    }
  }